

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O3

UnicodeString *
icu_63::SimpleFormatter::getTextWithNoArguments
          (UnicodeString *__return_storage_ptr__,UChar *compiledPattern,
          int32_t compiledPatternLength)

{
  long lVar1;
  int iVar2;
  int srcLength;
  
  if (compiledPatternLength == 0) {
    UnicodeString::UnicodeString(__return_storage_ptr__,-1,0,0);
  }
  else {
    UnicodeString::UnicodeString
              (__return_storage_ptr__,~(uint)(ushort)*compiledPattern + compiledPatternLength,0,0);
    if (1 < compiledPatternLength) {
      iVar2 = 1;
      do {
        lVar1 = (long)iVar2;
        iVar2 = iVar2 + 1;
        if (0x100 < (ushort)compiledPattern[lVar1]) {
          srcLength = (ushort)compiledPattern[lVar1] - 0x100;
          UnicodeString::doAppend(__return_storage_ptr__,compiledPattern + iVar2,0,srcLength);
          iVar2 = iVar2 + srcLength;
        }
      } while (iVar2 < compiledPatternLength);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString SimpleFormatter::getTextWithNoArguments(
        const UChar *compiledPattern, int32_t compiledPatternLength) {
    int32_t capacity = compiledPatternLength - 1 -
            getArgumentLimit(compiledPattern, compiledPatternLength);
    UnicodeString sb(capacity, 0, 0);  // Java: StringBuilder
    for (int32_t i = 1; i < compiledPatternLength;) {
        int32_t segmentLength = compiledPattern[i++] - ARG_NUM_LIMIT;
        if (segmentLength > 0) {
            sb.append(compiledPattern + i, segmentLength);
            i += segmentLength;
        }
    }
    return sb;
}